

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setButtonLayout(QWizard *this,QList<QWizard::WizardButton> *layout)

{
  long lVar1;
  bool bVar2;
  QWizardPrivate *this_00;
  QList<QWizard::WizardButton> *function;
  qsizetype qVar3;
  const_reference pWVar4;
  QList<QWizard::WizardButton> *in_RSI;
  long in_FS_OFFSET;
  WizardButton button2;
  int j;
  WizardButton button1;
  int i;
  QWizardPrivate *d;
  WizardButton in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  WizardButton WVar5;
  int iVar6;
  QWizardPrivate *in_stack_ffffffffffffffd8;
  WizardButton in_stack_ffffffffffffffec;
  QWizardPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7bbb7a);
  iVar6 = 0;
  while( true ) {
    function = (QList<QWizard::WizardButton> *)(long)iVar6;
    qVar3 = QList<QWizard::WizardButton>::size(in_RSI);
    if (qVar3 <= (long)function) break;
    pWVar4 = QList<QWizard::WizardButton>::at
                       ((QList<QWizard::WizardButton> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (qsizetype)function);
    WVar5 = *pWVar4;
    if ((WVar5 != NoButton) && (WVar5 != NButtons)) {
      bVar2 = QWizardPrivate::ensureButton(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
      if (!bVar2) goto LAB_007bbc9a;
      for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < iVar6;
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
        pWVar4 = QList<QWizard::WizardButton>::at
                           ((QList<QWizard::WizardButton> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (qsizetype)function);
        in_stack_ffffffffffffffb0 = *pWVar4;
        if (in_stack_ffffffffffffffb0 == WVar5) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)this_00,(char *)CONCAT44(iVar6,WVar5),
                     in_stack_ffffffffffffffb4,(char *)function);
          QMessageLogger::warning
                    (&stack0xffffffffffffffd8,"QWizard::setButtonLayout: Duplicate button in layout"
                    );
          goto LAB_007bbc9a;
        }
      }
    }
    iVar6 = iVar6 + 1;
  }
  this_00->buttonsHaveCustomLayout = true;
  QList<QWizard::WizardButton>::operator=
            ((QList<QWizard::WizardButton> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),function);
  QWizardPrivate::updateButtonLayout(in_stack_ffffffffffffffd8);
LAB_007bbc9a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setButtonLayout(const QList<WizardButton> &layout)
{
    Q_D(QWizard);

    for (int i = 0; i < layout.size(); ++i) {
        WizardButton button1 = layout.at(i);

        if (button1 == NoButton || button1 == Stretch)
            continue;
        if (!d->ensureButton(button1))
            return;

        // O(n^2), but n is very small
        for (int j = 0; j < i; ++j) {
            WizardButton button2 = layout.at(j);
            if (Q_UNLIKELY(button2 == button1)) {
                qWarning("QWizard::setButtonLayout: Duplicate button in layout");
                return;
            }
        }
    }

    d->buttonsHaveCustomLayout = true;
    d->buttonsCustomLayout = layout;
    d->updateButtonLayout();
}